

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::RunChild(cmCTestLaunch *this)

{
  int64_t iVar1;
  undefined4 uVar2;
  undefined3 uVar3;
  bool bVar4;
  _Ios_Openmode _Var5;
  uint uVar6;
  reference __lhs;
  cmUVProcessChainBuilder *pcVar7;
  uv_loop_t *loop;
  Status *pSVar8;
  byte local_55a;
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_508;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [8];
  anon_class_16_2_57ddfa98 beginRead;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> errorHandle;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outputHandle;
  undefined1 local_4a8 [5];
  cmProcessOutput processOutput;
  bool errFinished;
  bool outFinished;
  uv_pipe_ptr errPipe;
  uv_pipe_ptr outPipe;
  cmUVProcessChain chain;
  ofstream ferr;
  ofstream fout;
  undefined1 local_70 [8];
  cmUVProcessChainBuilder builder;
  cmCTestLaunch *this_local;
  
  builder.Loop = (uv_loop_t *)this;
  bVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->RealArgs);
  if (!bVar4) {
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->RealArgs,0);
    bVar4 = std::operator==(__lhs,":");
    if (!bVar4) {
      cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_70);
      cmUVProcessChainBuilder::AddCommand((cmUVProcessChainBuilder *)local_70,&this->RealArgV);
      std::ofstream::ofstream(&ferr.field_0x1f8);
      std::ofstream::ofstream(&chain);
      if (((this->Reporter).Passthru & 1U) == 0) {
        pcVar7 = cmUVProcessChainBuilder::SetBuiltinStream
                           ((cmUVProcessChainBuilder *)local_70,Stream_OUTPUT);
        cmUVProcessChainBuilder::SetBuiltinStream(pcVar7,Stream_ERROR);
        _Var5 = std::__cxx11::string::c_str();
        std::operator|(_S_out,_S_bin);
        std::ofstream::open(&ferr.field_0x1f8,_Var5);
        _Var5 = std::__cxx11::string::c_str();
        std::operator|(_S_out,_S_bin);
        std::ofstream::open((char *)&chain,_Var5);
      }
      else {
        pcVar7 = cmUVProcessChainBuilder::SetExternalStream
                           ((cmUVProcessChainBuilder *)local_70,Stream_OUTPUT,_stdout);
        cmUVProcessChainBuilder::SetExternalStream(pcVar7,Stream_ERROR,_stderr);
      }
      cmUVProcessChainBuilder::Start
                ((cmUVProcessChainBuilder *)
                 &outPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                  handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      ::cm::uv_pipe_ptr::uv_pipe_ptr
                ((uv_pipe_ptr *)
                 &errPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                  handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      ::cm::uv_pipe_ptr::uv_pipe_ptr((uv_pipe_ptr *)local_4a8);
      outputHandle._M_t.
      super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t.
      super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
      super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl._7_1_ = 1;
      outputHandle._M_t.
      super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t.
      super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
      super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl._6_1_ = 1;
      cmProcessOutput::cmProcessOutput
                ((cmProcessOutput *)
                 ((long)&outputHandle._M_t.
                         super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                         .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 5),
                 Auto,0x400);
      std::unique_ptr<cmUVStreamReadHandle,std::default_delete<cmUVStreamReadHandle>>::
      unique_ptr<std::default_delete<cmUVStreamReadHandle>,void>
                ((unique_ptr<cmUVStreamReadHandle,std::default_delete<cmUVStreamReadHandle>> *)
                 &errorHandle);
      std::unique_ptr<cmUVStreamReadHandle,std::default_delete<cmUVStreamReadHandle>>::
      unique_ptr<std::default_delete<cmUVStreamReadHandle>,void>
                ((unique_ptr<cmUVStreamReadHandle,std::default_delete<cmUVStreamReadHandle>> *)
                 &beginRead.processOutput);
      if (((this->Reporter).Passthru & 1U) == 0) {
        local_4d0 = (undefined1  [8])
                    &outPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                     handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        beginRead.chain =
             (cmUVProcessChain *)
             ((long)&outputHandle._M_t.
                     super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                     .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 5);
        uVar6 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_4d0);
        RunChild::anon_class_16_2_57ddfa98::operator()
                  ((anon_class_16_2_57ddfa98 *)(local_4e0 + 8),(uv_pipe_ptr *)local_4d0,
                   (int)&errPipe + 8,(ostream *)(ulong)uVar6,(ofstream *)&std::cout,
                   (bool *)&ferr.field_0x1f8,&this->HaveOut,(int)&outputHandle + 7);
        std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::operator=
                  (&errorHandle,
                   (unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                   (local_4e0 + 8));
        std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::
        ~unique_ptr((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                    (local_4e0 + 8));
        uVar6 = cmUVProcessChain::ErrorStream
                          ((cmUVProcessChain *)
                           &outPipe.super_uv_handle_ptr_<uv_pipe_s>.
                            super_uv_handle_ptr_base_<uv_pipe_s>.handle.
                            super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        RunChild::anon_class_16_2_57ddfa98::operator()
                  ((anon_class_16_2_57ddfa98 *)local_4e0,(uv_pipe_ptr *)local_4d0,(int)local_4a8,
                   (ostream *)(ulong)uVar6,(ofstream *)&std::cerr,(bool *)&chain,&this->HaveErr,
                   (int)&outputHandle + 6);
        std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::operator=
                  ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                   &beginRead.processOutput,
                   (unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                   local_4e0);
        std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::
        ~unique_ptr((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                    local_4e0);
      }
      while( true ) {
        bVar4 = cmUVProcessChain::Finished
                          ((cmUVProcessChain *)
                           &outPipe.super_uv_handle_ptr_<uv_pipe_s>.
                            super_uv_handle_ptr_base_<uv_pipe_s>.handle.
                            super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        local_55a = 0;
        if ((bVar4) &&
           (local_55a = 0,
           (outputHandle._M_t.
            super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
            .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl._7_1_ & 1) != 0)) {
          local_55a = outputHandle._M_t.
                      super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                      .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl._6_1_;
        }
        if (((local_55a ^ 0xff) & 1) == 0) break;
        loop = cmUVProcessChain::GetLoop
                         ((cmUVProcessChain *)
                          &outPipe.super_uv_handle_ptr_<uv_pipe_s>.
                           super_uv_handle_ptr_base_<uv_pipe_s>.handle.
                           super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        uv_run(loop,UV_RUN_ONCE);
      }
      pSVar8 = cmUVProcessChain::GetStatus
                         ((cmUVProcessChain *)
                          &outPipe.super_uv_handle_ptr_<uv_pipe_s>.
                           super_uv_handle_ptr_base_<uv_pipe_s>.handle.
                           super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount,0);
      uVar2 = *(undefined4 *)&pSVar8->field_0x14;
      (this->Reporter).Status.TermSignal = pSVar8->TermSignal;
      *(undefined4 *)&(this->Reporter).Status.field_0x14 = uVar2;
      bVar4 = pSVar8->Finished;
      uVar3 = *(undefined3 *)&pSVar8->field_0x5;
      iVar1 = pSVar8->ExitStatus;
      (this->Reporter).Status.SpawnResult = pSVar8->SpawnResult;
      (this->Reporter).Status.Finished = bVar4;
      *(undefined3 *)&(this->Reporter).Status.field_0x5 = uVar3;
      (this->Reporter).Status.ExitStatus = iVar1;
      cmUVProcessChain::Status::GetException_abi_cxx11_(&local_508,&(this->Reporter).Status);
      std::
      pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_508);
      if (local_508.first == Spawn) {
        (this->Reporter).ExitCode = 1;
      }
      else {
        (this->Reporter).ExitCode = (int)(this->Reporter).Status.ExitStatus;
      }
      std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
                ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                 &beginRead.processOutput);
      std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
                (&errorHandle);
      ::cm::uv_pipe_ptr::~uv_pipe_ptr((uv_pipe_ptr *)local_4a8);
      ::cm::uv_pipe_ptr::~uv_pipe_ptr
                ((uv_pipe_ptr *)
                 &errPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                  handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      cmUVProcessChain::~cmUVProcessChain
                ((cmUVProcessChain *)
                 &outPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                  handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::ofstream::~ofstream(&chain);
      std::ofstream::~ofstream(&ferr.field_0x1f8);
      cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_70);
      return;
    }
  }
  (this->Reporter).ExitCode = 0;
  return;
}

Assistant:

void cmCTestLaunch::RunChild()
{
  // Ignore noopt make rules
  if (this->RealArgs.empty() || this->RealArgs[0] == ":") {
    this->Reporter.ExitCode = 0;
    return;
  }

  // Prepare to run the real command.
  cmUVProcessChainBuilder builder;
  builder.AddCommand(this->RealArgV);

  cmsys::ofstream fout;
  cmsys::ofstream ferr;
  if (this->Reporter.Passthru) {
    // In passthru mode we just share the output pipes.
    builder.SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, stdout)
      .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, stderr);
  } else {
    // In full mode we record the child output pipes to log files.
    builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
      .SetBuiltinStream(cmUVProcessChainBuilder::Stream_ERROR);
    fout.open(this->Reporter.LogOut.c_str(), std::ios::out | std::ios::binary);
    ferr.open(this->Reporter.LogErr.c_str(), std::ios::out | std::ios::binary);
  }

#ifdef _WIN32
  // Do this so that newline transformation is not done when writing to cout
  // and cerr below.
  _setmode(fileno(stdout), _O_BINARY);
  _setmode(fileno(stderr), _O_BINARY);
#endif

  // Run the real command.
  auto chain = builder.Start();

  // Record child stdout and stderr if necessary.
  cm::uv_pipe_ptr outPipe;
  cm::uv_pipe_ptr errPipe;
  bool outFinished = true;
  bool errFinished = true;
  cmProcessOutput processOutput;
  std::unique_ptr<cmUVStreamReadHandle> outputHandle;
  std::unique_ptr<cmUVStreamReadHandle> errorHandle;
  if (!this->Reporter.Passthru) {
    auto beginRead = [&chain, &processOutput](
                       cm::uv_pipe_ptr& pipe, int stream, std::ostream& out,
                       cmsys::ofstream& file, bool& haveData, bool& finished,
                       int id) -> std::unique_ptr<cmUVStreamReadHandle> {
      pipe.init(chain.GetLoop(), 0);
      uv_pipe_open(pipe, stream);
      finished = false;
      return cmUVStreamRead(
        pipe,
        [&processOutput, &out, &file, id, &haveData](std::vector<char> data) {
          std::string strdata;
          processOutput.DecodeText(data.data(), data.size(), strdata, id);
          file.write(strdata.c_str(), strdata.size());
          out.write(strdata.c_str(), strdata.size());
          haveData = true;
        },
        [&processOutput, &out, &file, &finished, id]() {
          std::string strdata;
          processOutput.DecodeText(std::string(), strdata, id);
          if (!strdata.empty()) {
            file.write(strdata.c_str(), strdata.size());
            out.write(strdata.c_str(), strdata.size());
          }
          finished = true;
        });
    };
    outputHandle = beginRead(outPipe, chain.OutputStream(), std::cout, fout,
                             this->HaveOut, outFinished, 1);
    errorHandle = beginRead(errPipe, chain.ErrorStream(), std::cerr, ferr,
                            this->HaveErr, errFinished, 2);
  }

  // Wait for the real command to finish.
  while (!(chain.Finished() && outFinished && errFinished)) {
    uv_run(&chain.GetLoop(), UV_RUN_ONCE);
  }
  this->Reporter.Status = chain.GetStatus(0);
  if (this->Reporter.Status.GetException().first ==
      cmUVProcessChain::ExceptionCode::Spawn) {
    this->Reporter.ExitCode = 1;
  } else {
    this->Reporter.ExitCode =
      static_cast<int>(this->Reporter.Status.ExitStatus);
  }
}